

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O2

int32_t ll_ftp_msg_process(ll_ftp_t *f,uint8_t *buf,uint8_t len)

{
  uint32_t *__s;
  ll_ftp_state_t lVar1;
  uint uVar2;
  uint32_t uVar3;
  uint16_t uVar4;
  int32_t iVar5;
  uint32_t uVar6;
  ll_ftp_return_code_t lVar7;
  ll_ftp_return_code_t lVar8;
  uint uVar9;
  uint32_t len_1;
  size_t sVar10;
  ulong uVar11;
  uint32_t j;
  uint uVar12;
  uint32_t uVar13;
  uint32_t offset;
  uint32_t uVar14;
  bool bVar15;
  uint32_t crc;
  ll_ftp_msg_t ftp_msg;
  time local_48;
  
  lVar1 = f->state;
  if (lVar1 != APPLY) {
    if (lVar1 != SEGMENT) {
      if (lVar1 == IDLE) {
        iVar5 = ll_ftp_parse_rx_msg(buf,len,&ftp_msg);
        if (iVar5 != 0) {
          return iVar5;
        }
        if ((ftp_msg.msg_type != TX_SEGMENT) && (ftp_msg.msg_type != TX_INIT)) {
          return 2;
        }
        goto LAB_00104ab2;
      }
      goto LAB_00104b50;
    }
    iVar5 = ll_ftp_parse_rx_msg(buf,len,&ftp_msg);
    if (iVar5 != 0) {
      return iVar5;
    }
    switch(ftp_msg.msg_type) {
    case TX_INIT:
      goto switchD_001048a8_caseD_0;
    case TX_CANCEL:
      if (ftp_msg.file_id != f->file_id) {
        return 3;
      }
      if (ftp_msg.file_version != f->file_version) {
        return 3;
      }
      break;
    case TX_APPLY:
      uVar4 = ll_ftp_ack_segs_request_generate(f);
      lVar8 = ll_ftp_send_uplink(f,(ulong)uVar4);
      return (uint)(lVar8 != LL_FTP_OK) << 2;
    case TX_SEGMENT:
      if ((ftp_msg.file_id != f->file_id) || (ftp_msg.file_version != f->file_version))
      goto LAB_00104ab2;
      ll_ftp_reset(f);
      lVar8 = (*(f->cb).write)(ftp_msg.file_id,ftp_msg.file_version,
                               (uint)ftp_msg.segment_number * 0x6b,ftp_msg.payload,
                               ftp_msg.payload_len);
      if (lVar8 == LL_FTP_OK) {
        iVar5 = 0;
        if (ftp_msg.segment_number < 0x2649) {
          f->rx_segs[ftp_msg.segment_number >> 5] =
               f->rx_segs[ftp_msg.segment_number >> 5] | 1 << ((byte)ftp_msg.segment_number & 0x1f);
        }
      }
      else {
        iVar5 = 3;
      }
      uVar9 = (uint)(f->num_segs >> 5);
      __s = f->rx_segs;
      bVar15 = true;
      for (uVar11 = 0; uVar11 != uVar9 + 1; uVar11 = uVar11 + 1) {
        if (uVar11 == uVar9) {
          uVar12 = 0;
          do {
            if ((f->num_segs & 0x1f) == uVar12) goto LAB_00104bc3;
            uVar2 = uVar12 & 0x1f;
            uVar12 = uVar12 + 1;
          } while ((__s[uVar9] >> uVar2 & 1) != 0);
          bVar15 = false;
        }
        else if (__s[uVar11] != 0xffffffff) {
          return iVar5;
        }
LAB_00104bc3:
      }
      if (!bVar15) {
        return iVar5;
      }
      lVar8 = (*(f->cb).read)(f->file_id,f->file_version,0,(uint8_t *)&local_48,4);
      uVar6 = (uint32_t)local_48.tv_sec;
      if (((lVar8 != LL_FTP_OK) ||
          (lVar8 = (*(f->cb).read)(f->file_id,f->file_version,4,(uint8_t *)&local_48,4),
          uVar13 = (uint32_t)local_48.tv_sec, lVar8 != LL_FTP_OK)) ||
         (lVar8 = (*(f->cb).read)(f->file_id,f->file_version,8,(uint8_t *)&local_48,4),
         uVar3 = (uint32_t)local_48.tv_sec, lVar8 != LL_FTP_OK)) {
LAB_00104d37:
        memset(__s,0,0x4cc);
        ll_ftp_reset(f);
        lVar8 = (*(f->cb).close)(f->file_id,f->file_version);
        if ((lVar8 == LL_FTP_OK) &&
           (lVar8 = (*(f->cb).open)(f->file_id,f->file_version,f->file_size), lVar8 == LL_FTP_OK)) {
          return 0;
        }
        break;
      }
      uVar14 = 4;
      lVar8 = (*(f->cb).read)(f->file_id,f->file_version,0xc,(uint8_t *)&local_48,4);
      if (((lVar8 != LL_FTP_OK) || (uVar13 != f->file_size)) ||
         ((uVar3 != f->file_id || ((uint32_t)local_48.tv_sec != f->file_version))))
      goto LAB_00104d37;
      crc = 0;
      sVar10 = 0x10;
      while( true ) {
        uVar9 = uVar13 + 0x10;
        if (uVar9 < uVar14 || uVar9 - uVar14 == 0) break;
        if (uVar9 < uVar14 + (int)sVar10) {
          sVar10 = (size_t)(uVar9 - uVar14);
        }
        lVar8 = (*(f->cb).read)(f->file_id,f->file_version,uVar14,(uint8_t *)&local_48,
                                (uint16_t)sVar10);
        if (lVar8 == LL_FTP_OK) {
          crc = crc32(crc,(uint8_t *)&local_48,sVar10);
        }
        uVar14 = uVar14 + (int)sVar10;
        uVar13 = f->file_size;
      }
      if (crc != uVar6) goto LAB_00104d37;
      lVar8 = (*(f->cb).close)(f->file_id,f->file_version);
      if (lVar8 != LL_FTP_OK) {
LAB_00104d2f:
        f->state = IDLE;
        goto LAB_00104b50;
      }
      ll_ftp_ack_segs_complete_generate(f);
      lVar8 = ll_ftp_send_uplink(f,0xe);
      if (lVar8 != LL_FTP_OK) goto LAB_00104d2f;
      f->state = APPLY;
      goto LAB_00104ad0;
    default:
      return 3;
    case TICK:
      gettime(&local_48);
      iVar5 = ll_difftime(&f->time_last_msg,&local_48);
      if (iVar5 < 0x10) {
        return 0;
      }
      if (f->retry_count < 5) {
        uVar4 = ll_ftp_ack_segs_request_generate(f);
        sVar10 = (size_t)uVar4;
        goto LAB_00104b0b;
      }
    }
    iVar5 = ll_ftp_idle_start(f);
    if (iVar5 != 0) {
      return iVar5;
    }
    f->state = IDLE;
    ll_ftp_init(f,&f->cb);
    goto LAB_00104ad0;
  }
  iVar5 = ll_ftp_parse_rx_msg(buf,len,&ftp_msg);
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = 3;
  switch(ftp_msg.msg_type) {
  case TX_INIT:
switchD_001048a8_caseD_0:
    if ((ftp_msg.file_id == f->file_id) && (ftp_msg.file_version == f->file_version)) {
      return 3;
    }
    break;
  case TX_CANCEL:
    if (ftp_msg.file_id != f->file_id) {
      return 3;
    }
    if (ftp_msg.file_version != f->file_version) {
      return 3;
    }
    goto LAB_00104b26;
  case TX_APPLY:
    if (ftp_msg.file_id != f->file_id) {
      return 3;
    }
    if (ftp_msg.file_version != f->file_version) {
      return 3;
    }
    lVar8 = (*(f->cb).apply)(ftp_msg.file_id,ftp_msg.file_version,f->file_size);
    f->tx_buf[0] = '\x06';
    f->tx_buf[5] = -(lVar8 != LL_FTP_OK);
    *(undefined8 *)(f->tx_buf + 6) = *(undefined8 *)&f->file_id;
    uVar6 = crc32(0,f->tx_buf + 5,9);
    *(uint32_t *)(f->tx_buf + 1) = uVar6;
    lVar7 = ll_ftp_send_uplink(f,0xe);
    bVar15 = lVar7 != LL_FTP_OK || lVar8 != LL_FTP_OK;
    goto LAB_00104b29;
  case TX_SEGMENT:
    if ((ftp_msg.file_id == f->file_id) && (ftp_msg.file_version == f->file_version)) {
      ll_ftp_reset(f);
      return 3;
    }
    break;
  default:
    goto switchD_001048a8_caseD_4;
  case TICK:
    gettime(&local_48);
    iVar5 = ll_difftime(&f->time_last_msg,&local_48);
    if (iVar5 < 0x10) {
      return 0;
    }
    if (f->retry_count < 5) {
      ll_ftp_ack_segs_complete_generate(f);
      sVar10 = 0xe;
LAB_00104b0b:
      lVar8 = ll_ftp_send_uplink(f,sVar10);
      f->retry_count = f->retry_count + '\x01';
      return (uint)(lVar8 != LL_FTP_OK) << 2;
    }
LAB_00104b26:
    bVar15 = false;
LAB_00104b29:
    iVar5 = ll_ftp_idle_start(f);
    ll_ftp_init(f,&f->cb);
    if (iVar5 == 0) {
      f->state = IDLE;
      iVar5 = 0;
    }
    if (bVar15) {
LAB_00104b50:
      iVar5 = 4;
    }
    goto switchD_001048a8_caseD_4;
  }
LAB_00104ab2:
  iVar5 = ll_ftp_segment_start(f,&ftp_msg);
  if (iVar5 == 0) {
    f->state = SEGMENT;
LAB_00104ad0:
    iVar5 = 0;
  }
switchD_001048a8_caseD_4:
  return iVar5;
}

Assistant:

int32_t ll_ftp_msg_process(ll_ftp_t* f, uint8_t* buf, uint8_t len)
{
    int32_t ret = 0;
    switch (f->state)
    {
        case IDLE:
            ret = ll_ftp_idle_process_msg(f, buf, len);
            break;
        case SEGMENT:
            ret = ll_ftp_segment_process_msg(f, buf, len);
            break;
        case APPLY:
            ret = ll_ftp_apply_process_msg(f, buf, len);
            break;
        default:
            ret = LL_FTP_ERROR;
            break;
    }

    return ret;
}